

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

void qt_memfill_template<quint24>(quint24 *dest,quint24 color,qsizetype count)

{
  long lVar1;
  undefined2 uVar2;
  undefined1 uVar3;
  long in_RDX;
  undefined4 in_ESI;
  undefined2 *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  long local_28;
  undefined2 *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (undefined2)in_ESI;
  uVar3 = (undefined1)((uint)in_ESI >> 0x10);
  if (in_RDX != 0) {
    local_28 = in_RDX + 7;
    if (in_RDX + 7 < 0) {
      local_28 = in_RDX + 0xe;
    }
    local_28 = local_28 >> 3;
    local_18 = in_RDI;
    switch((uint)in_RDX & 7) {
    case 0:
      local_18 = in_RDI;
      do {
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_7:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_6:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_5:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_4:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_3:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_2:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_18 = (undefined2 *)((long)local_18 + 3);
switchD_00b7e069_caseD_1:
        *local_18 = uVar2;
        *(undefined1 *)(local_18 + 1) = uVar3;
        local_28 = local_28 + -1;
        local_18 = (undefined2 *)((long)local_18 + 3);
      } while (0 < local_28);
      break;
    case 1:
      goto switchD_00b7e069_caseD_1;
    case 2:
      goto switchD_00b7e069_caseD_2;
    case 3:
      goto switchD_00b7e069_caseD_3;
    case 4:
      goto switchD_00b7e069_caseD_4;
    case 5:
      goto switchD_00b7e069_caseD_5;
    case 6:
      goto switchD_00b7e069_caseD_6;
    case 7:
      goto switchD_00b7e069_caseD_7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void qt_memfill_template(T *dest, T color, qsizetype count)
{
    if (!count)
        return;

    qsizetype n = (count + 7) / 8;
    switch (count & 0x07)
    {
    case 0: do { *dest++ = color; Q_FALLTHROUGH();
    case 7:      *dest++ = color; Q_FALLTHROUGH();
    case 6:      *dest++ = color; Q_FALLTHROUGH();
    case 5:      *dest++ = color; Q_FALLTHROUGH();
    case 4:      *dest++ = color; Q_FALLTHROUGH();
    case 3:      *dest++ = color; Q_FALLTHROUGH();
    case 2:      *dest++ = color; Q_FALLTHROUGH();
    case 1:      *dest++ = color;
    } while (--n > 0);
    }
}